

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injected.h
# Opt level: O2

ptr_type * __thiscall inject::context<0>::injected<service>::ptr(injected<service> *this)

{
  undefined1 local_20 [16];
  
  if ((this->_ptr).px == (element_type *)0x0) {
    get_current();
    instance<service>((context<0> *)local_20);
    boost::shared_ptr<service>::operator=(&this->_ptr,(shared_ptr<service> *)local_20);
    boost::detail::shared_count::~shared_count((shared_count *)(local_20 + 8));
  }
  return &this->_ptr;
}

Assistant:

const ptr_type& ptr() const {
      if (_ptr.get() == 0) {
        *const_cast<ptr_type*>(&_ptr) =
          context<ID>::get_current().template instance<T>();
      }
      return _ptr;
    }